

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O1

int secp256k1_rangeproof_rewind_inner
              (secp256k1_scalar *blind,uint64_t *v,uchar *m,size_t *mlen,secp256k1_scalar *ev,
              secp256k1_scalar *s,size_t *rsizes,size_t rings,uchar *nonce,secp256k1_ge *commit,
              uchar *proof,size_t len,secp256k1_ge *genp)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  int i;
  int iVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  long lVar108;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  ulong uVar115;
  secp256k1_scalar *b;
  secp256k1_scalar *psVar116;
  secp256k1_scalar *psVar117;
  uchar *puVar118;
  size_t sVar119;
  ulong uVar120;
  ulong uVar121;
  ulong uVar122;
  ulong uVar123;
  ulong uVar124;
  ulong uVar125;
  ulong uVar126;
  ulong uVar127;
  ulong uVar128;
  ulong uVar129;
  ulong uVar130;
  ulong uVar131;
  ulong uVar132;
  ulong uVar133;
  ulong uVar134;
  ulong uVar135;
  ulong uVar136;
  ulong uVar137;
  long lVar138;
  undefined1 *puVar139;
  bool bVar140;
  uchar tmp [32];
  secp256k1_scalar stmp;
  secp256k1_scalar stmp_1;
  uint64_t l [8];
  secp256k1_scalar sec [32];
  uchar prep [4096];
  secp256k1_scalar s_orig [128];
  byte local_2508;
  undefined7 uStack_2507;
  uint64_t uStack_2500;
  uint64_t local_24f8;
  uint64_t uStack_24f0;
  ulong local_24e8;
  uchar *local_24e0;
  secp256k1_scalar local_24d8;
  secp256k1_scalar *local_24b8;
  secp256k1_scalar *local_24b0;
  long local_24a8;
  ulong local_24a0;
  secp256k1_scalar local_2498;
  uint64_t local_2478;
  long local_2470;
  long local_2468;
  long local_2460;
  long local_2458;
  long local_2450;
  undefined1 local_2448 [16];
  secp256k1_scalar local_2438 [27];
  undefined1 auStack_20d8 [160];
  uchar local_2038 [8];
  uint64_t auStack_2030 [511];
  secp256k1_scalar local_1038 [128];
  
  memset(local_2038,0,0x1000);
  secp256k1_rangeproof_genrand
            (local_2438,local_1038,local_2038,rsizes,rings,nonce,commit,proof,len,genp);
  *v = 0xffffffffffffffff;
  blind->d[0] = 0;
  blind->d[1] = 0;
  blind->d[2] = 0;
  blind->d[3] = 0;
  if ((rings == 1) && (*rsizes == 1)) {
    secp256k1_scalar_negate(blind,s);
    secp256k1_scalar_add(blind,blind,local_1038);
    secp256k1_scalar_inverse(&local_2498,ev);
    uVar105 = blind->d[0];
    uVar106 = blind->d[1];
    uVar107 = blind->d[2];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar105;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_2498.d[0];
    uVar109 = SUB168(auVar2 * auVar50,8);
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar109;
    local_2478 = SUB168(auVar2 * auVar50,0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar105;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_2498.d[1];
    auVar3 = auVar3 * auVar51;
    uVar120 = SUB168(auVar3 + auVar100,0);
    uVar128 = SUB168(auVar3 + auVar100,8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar106;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_2498.d[0];
    uVar110 = SUB168(auVar4 * auVar52,8);
    uVar104 = SUB168(auVar4 * auVar52,0);
    local_2470 = uVar120 + uVar104;
    uVar104 = (ulong)CARRY8(uVar120,uVar104);
    uVar120 = uVar128 + uVar110;
    uVar129 = uVar120 + uVar104;
    uVar130 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar109,auVar3._0_8_)) +
              (ulong)(CARRY8(uVar128,uVar110) || CARRY8(uVar120,uVar104));
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar105;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_2498.d[2];
    uVar111 = SUB168(auVar5 * auVar53,8);
    uVar104 = SUB168(auVar5 * auVar53,0);
    uVar109 = uVar129 + uVar104;
    uVar104 = (ulong)CARRY8(uVar129,uVar104);
    uVar110 = uVar130 + uVar111;
    uVar131 = uVar110 + uVar104;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar106;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_2498.d[1];
    uVar112 = SUB168(auVar6 * auVar54,8);
    uVar120 = SUB168(auVar6 * auVar54,0);
    uVar129 = uVar109 + uVar120;
    uVar120 = (ulong)CARRY8(uVar109,uVar120);
    uVar128 = uVar131 + uVar112;
    uVar132 = uVar128 + uVar120;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar107;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_2498.d[0];
    uVar113 = SUB168(auVar7 * auVar55,8);
    uVar109 = SUB168(auVar7 * auVar55,0);
    local_2468 = uVar129 + uVar109;
    uVar109 = (ulong)CARRY8(uVar129,uVar109);
    uVar129 = uVar132 + uVar113;
    uVar133 = uVar129 + uVar109;
    uVar121 = (ulong)(CARRY8(uVar130,uVar111) || CARRY8(uVar110,uVar104)) +
              (ulong)(CARRY8(uVar131,uVar112) || CARRY8(uVar128,uVar120)) +
              (ulong)(CARRY8(uVar132,uVar113) || CARRY8(uVar129,uVar109));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar105;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_2498.d[3];
    uVar113 = SUB168(auVar8 * auVar56,8);
    uVar105 = SUB168(auVar8 * auVar56,0);
    uVar109 = uVar133 + uVar105;
    uVar104 = (ulong)CARRY8(uVar133,uVar105);
    uVar128 = uVar121 + uVar113;
    uVar133 = uVar128 + uVar104;
    uVar105 = blind->d[3];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar106;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_2498.d[2];
    uVar130 = SUB168(auVar9 * auVar57,8);
    uVar120 = SUB168(auVar9 * auVar57,0);
    uVar110 = uVar109 + uVar120;
    uVar120 = (ulong)CARRY8(uVar109,uVar120);
    uVar129 = uVar133 + uVar130;
    uVar122 = uVar129 + uVar120;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar107;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_2498.d[1];
    uVar131 = SUB168(auVar10 * auVar58,8);
    uVar109 = SUB168(auVar10 * auVar58,0);
    uVar112 = uVar110 + uVar109;
    uVar109 = (ulong)CARRY8(uVar110,uVar109);
    uVar111 = uVar122 + uVar131;
    uVar123 = uVar111 + uVar109;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar105;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_2498.d[0];
    uVar132 = SUB168(auVar11 * auVar59,8);
    uVar110 = SUB168(auVar11 * auVar59,0);
    local_2460 = uVar112 + uVar110;
    uVar110 = (ulong)CARRY8(uVar112,uVar110);
    uVar112 = uVar123 + uVar132;
    uVar124 = uVar112 + uVar110;
    uVar113 = (ulong)(CARRY8(uVar121,uVar113) || CARRY8(uVar128,uVar104)) +
              (ulong)(CARRY8(uVar133,uVar130) || CARRY8(uVar129,uVar120)) +
              (ulong)(CARRY8(uVar122,uVar131) || CARRY8(uVar111,uVar109)) +
              (ulong)(CARRY8(uVar123,uVar132) || CARRY8(uVar112,uVar110));
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar106;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_2498.d[3];
    uVar129 = SUB168(auVar12 * auVar60,8);
    uVar106 = SUB168(auVar12 * auVar60,0);
    uVar120 = uVar124 + uVar106;
    uVar106 = (ulong)CARRY8(uVar124,uVar106);
    uVar109 = uVar113 + uVar129;
    uVar130 = uVar109 + uVar106;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar107;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_2498.d[2];
    uVar111 = SUB168(auVar13 * auVar61,8);
    uVar104 = SUB168(auVar13 * auVar61,0);
    uVar128 = uVar120 + uVar104;
    uVar104 = (ulong)CARRY8(uVar120,uVar104);
    uVar110 = uVar130 + uVar111;
    uVar131 = uVar110 + uVar104;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar105;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_2498.d[1];
    uVar112 = SUB168(auVar14 * auVar62,8);
    uVar120 = SUB168(auVar14 * auVar62,0);
    local_2458 = uVar128 + uVar120;
    uVar120 = (ulong)CARRY8(uVar128,uVar120);
    uVar128 = uVar131 + uVar112;
    uVar132 = uVar128 + uVar120;
    uVar128 = (ulong)(CARRY8(uVar113,uVar129) || CARRY8(uVar109,uVar106)) +
              (ulong)(CARRY8(uVar130,uVar111) || CARRY8(uVar110,uVar104)) +
              (ulong)(CARRY8(uVar131,uVar112) || CARRY8(uVar128,uVar120));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar107;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_2498.d[3];
    uVar109 = SUB168(auVar15 * auVar63,8);
    uVar106 = SUB168(auVar15 * auVar63,0);
    uVar120 = uVar132 + uVar106;
    uVar106 = (ulong)CARRY8(uVar132,uVar106);
    uVar104 = uVar128 + uVar109;
    uVar129 = uVar104 + uVar106;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar105;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_2498.d[2];
    uVar110 = SUB168(auVar16 * auVar64,8);
    uVar107 = SUB168(auVar16 * auVar64,0);
    local_2450 = uVar120 + uVar107;
    uVar107 = (ulong)CARRY8(uVar120,uVar107);
    uVar120 = uVar129 + uVar110;
    local_2448._8_8_ =
         (ulong)(CARRY8(uVar128,uVar109) || CARRY8(uVar104,uVar106)) +
         (ulong)(CARRY8(uVar129,uVar110) || CARRY8(uVar120,uVar107));
    local_2448._0_8_ = uVar120 + uVar107;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar105;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_2498.d[3];
    local_2448 = auVar17 * auVar65 + local_2448;
    secp256k1_scalar_reduce_512(blind,&local_2478);
    *v = 0;
    iVar103 = 1;
    if (mlen != (size_t *)0x0) {
      *mlen = 0;
    }
  }
  else {
    uVar105 = rings * 4 - 4;
    puVar139 = auStack_20d8 + rings * 0x80;
    uVar106 = 0;
    psVar117 = blind;
    local_24e0 = m;
    do {
      sVar1 = rsizes[rings - 1];
      lVar138 = ~uVar106 + uVar105 + sVar1;
      secp256k1_scalar_get_b32(&local_2508,s + lVar138);
      lVar108 = 0;
      do {
        (&local_2508)[lVar108] = (&local_2508)[lVar108] ^ puVar139[lVar108 + sVar1 * 0x20];
        lVar108 = lVar108 + 1;
      } while (lVar108 != 0x20);
      bVar140 = true;
      if ((((char)local_2508 < '\0') && (local_24f8 == uStack_24f0)) && (uStack_2500 == local_24f8))
      {
        lVar108 = 0x18;
        psVar117 = (secp256k1_scalar *)0x0;
        do {
          psVar117 = (secp256k1_scalar *)((ulong)(&local_2508)[lVar108] | (long)psVar117 << 8);
          lVar108 = lVar108 + 1;
        } while (lVar108 != 0x20);
        *v = (uint64_t)psVar117;
        local_1038[lVar138 + -0x80].d[2] = local_24f8;
        local_1038[lVar138 + -0x80].d[3] = uStack_24f0;
        *(ulong *)(local_2038 + lVar138 * 0x20) = CONCAT71(uStack_2507,local_2508);
        auStack_2030[lVar138 * 4] = uStack_2500;
        bVar140 = false;
      }
      if (!bVar140) goto LAB_0014c5aa;
      puVar139 = puVar139 + -0x20;
      bVar140 = uVar106 == 0;
      uVar106 = uVar106 + 1;
    } while (bVar140);
    uVar106 = 2;
LAB_0014c5aa:
    if (uVar106 < 2) {
      sVar1 = rsizes[rings - 1];
      local_24e8 = (ulong)((uint)((ulong)psVar117 >> ((char)(rings - 1) * '\x02' & 0x3fU)) & 3);
      if (~uVar106 + sVar1 != local_24e8) {
        local_24e8 = local_24e8 | uVar105;
        b = local_1038 + local_24e8;
        psVar116 = ev + local_24e8;
        secp256k1_scalar_negate(&local_24d8,s + local_24e8);
        secp256k1_scalar_add(&local_24d8,&local_24d8,b);
        secp256k1_scalar_inverse(&local_2498,psVar116);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_24d8.d[0];
        auVar66._8_8_ = 0;
        auVar66._0_8_ = local_2498.d[0];
        uVar120 = SUB168(auVar18 * auVar66,8);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar120;
        local_2478 = SUB168(auVar18 * auVar66,0);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_24d8.d[0];
        auVar67._8_8_ = 0;
        auVar67._0_8_ = local_2498.d[1];
        auVar19 = auVar19 * auVar67;
        uVar104 = SUB168(auVar19 + auVar101,0);
        uVar110 = SUB168(auVar19 + auVar101,8);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_24d8.d[1];
        auVar68._8_8_ = 0;
        auVar68._0_8_ = local_2498.d[0];
        uVar109 = SUB168(auVar20 * auVar68,8);
        uVar107 = SUB168(auVar20 * auVar68,0);
        local_2470 = uVar104 + uVar107;
        uVar107 = (ulong)CARRY8(uVar104,uVar107);
        uVar104 = uVar110 + uVar109;
        uVar128 = uVar104 + uVar107;
        uVar113 = (ulong)CARRY8(auVar19._8_8_,(ulong)CARRY8(uVar120,auVar19._0_8_)) +
                  (ulong)(CARRY8(uVar110,uVar109) || CARRY8(uVar104,uVar107));
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_24d8.d[0];
        auVar69._8_8_ = 0;
        auVar69._0_8_ = local_2498.d[2];
        uVar129 = SUB168(auVar21 * auVar69,8);
        uVar107 = SUB168(auVar21 * auVar69,0);
        uVar120 = uVar128 + uVar107;
        uVar107 = (ulong)CARRY8(uVar128,uVar107);
        uVar109 = uVar113 + uVar129;
        uVar130 = uVar109 + uVar107;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = local_24d8.d[1];
        auVar70._8_8_ = 0;
        auVar70._0_8_ = local_2498.d[1];
        uVar111 = SUB168(auVar22 * auVar70,8);
        uVar104 = SUB168(auVar22 * auVar70,0);
        uVar128 = uVar120 + uVar104;
        uVar104 = (ulong)CARRY8(uVar120,uVar104);
        uVar110 = uVar130 + uVar111;
        uVar131 = uVar110 + uVar104;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_24d8.d[2];
        auVar71._8_8_ = 0;
        auVar71._0_8_ = local_2498.d[0];
        uVar112 = SUB168(auVar23 * auVar71,8);
        uVar120 = SUB168(auVar23 * auVar71,0);
        local_2468 = uVar128 + uVar120;
        uVar120 = (ulong)CARRY8(uVar128,uVar120);
        uVar128 = uVar131 + uVar112;
        uVar121 = uVar128 + uVar120;
        uVar132 = (ulong)(CARRY8(uVar113,uVar129) || CARRY8(uVar109,uVar107)) +
                  (ulong)(CARRY8(uVar130,uVar111) || CARRY8(uVar110,uVar104)) +
                  (ulong)(CARRY8(uVar131,uVar112) || CARRY8(uVar128,uVar120));
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_24d8.d[0];
        auVar72._8_8_ = 0;
        auVar72._0_8_ = local_2498.d[3];
        uVar112 = SUB168(auVar24 * auVar72,8);
        uVar107 = SUB168(auVar24 * auVar72,0);
        uVar120 = uVar121 + uVar107;
        uVar107 = (ulong)CARRY8(uVar121,uVar107);
        uVar110 = uVar132 + uVar112;
        uVar121 = uVar110 + uVar107;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_24d8.d[1];
        auVar73._8_8_ = 0;
        auVar73._0_8_ = local_2498.d[2];
        uVar113 = SUB168(auVar25 * auVar73,8);
        uVar104 = SUB168(auVar25 * auVar73,0);
        uVar109 = uVar120 + uVar104;
        uVar104 = (ulong)CARRY8(uVar120,uVar104);
        uVar128 = uVar121 + uVar113;
        uVar133 = uVar128 + uVar104;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_24d8.d[2];
        auVar74._8_8_ = 0;
        auVar74._0_8_ = local_2498.d[1];
        uVar130 = SUB168(auVar26 * auVar74,8);
        uVar120 = SUB168(auVar26 * auVar74,0);
        uVar111 = uVar109 + uVar120;
        uVar120 = (ulong)CARRY8(uVar109,uVar120);
        uVar129 = uVar133 + uVar130;
        uVar122 = uVar129 + uVar120;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = local_24d8.d[3];
        auVar75._8_8_ = 0;
        auVar75._0_8_ = local_2498.d[0];
        uVar131 = SUB168(auVar27 * auVar75,8);
        uVar109 = SUB168(auVar27 * auVar75,0);
        local_2460 = uVar111 + uVar109;
        uVar109 = (ulong)CARRY8(uVar111,uVar109);
        uVar111 = uVar122 + uVar131;
        uVar123 = uVar111 + uVar109;
        uVar113 = (ulong)(CARRY8(uVar132,uVar112) || CARRY8(uVar110,uVar107)) +
                  (ulong)(CARRY8(uVar121,uVar113) || CARRY8(uVar128,uVar104)) +
                  (ulong)(CARRY8(uVar133,uVar130) || CARRY8(uVar129,uVar120)) +
                  (ulong)(CARRY8(uVar122,uVar131) || CARRY8(uVar111,uVar109));
        auVar28._8_8_ = 0;
        auVar28._0_8_ = local_24d8.d[1];
        auVar76._8_8_ = 0;
        auVar76._0_8_ = local_2498.d[3];
        uVar129 = SUB168(auVar28 * auVar76,8);
        uVar107 = SUB168(auVar28 * auVar76,0);
        uVar120 = uVar123 + uVar107;
        uVar107 = (ulong)CARRY8(uVar123,uVar107);
        uVar109 = uVar113 + uVar129;
        uVar130 = uVar109 + uVar107;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = local_24d8.d[2];
        auVar77._8_8_ = 0;
        auVar77._0_8_ = local_2498.d[2];
        uVar111 = SUB168(auVar29 * auVar77,8);
        uVar104 = SUB168(auVar29 * auVar77,0);
        uVar128 = uVar120 + uVar104;
        uVar104 = (ulong)CARRY8(uVar120,uVar104);
        uVar110 = uVar130 + uVar111;
        uVar131 = uVar110 + uVar104;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = local_24d8.d[3];
        auVar78._8_8_ = 0;
        auVar78._0_8_ = local_2498.d[1];
        uVar112 = SUB168(auVar30 * auVar78,8);
        uVar120 = SUB168(auVar30 * auVar78,0);
        local_2458 = uVar128 + uVar120;
        uVar120 = (ulong)CARRY8(uVar128,uVar120);
        uVar128 = uVar131 + uVar112;
        uVar132 = uVar128 + uVar120;
        uVar129 = (ulong)(CARRY8(uVar113,uVar129) || CARRY8(uVar109,uVar107)) +
                  (ulong)(CARRY8(uVar130,uVar111) || CARRY8(uVar110,uVar104)) +
                  (ulong)(CARRY8(uVar131,uVar112) || CARRY8(uVar128,uVar120));
        auVar31._8_8_ = 0;
        auVar31._0_8_ = local_24d8.d[2];
        auVar79._8_8_ = 0;
        auVar79._0_8_ = local_2498.d[3];
        uVar110 = SUB168(auVar31 * auVar79,8);
        uVar107 = SUB168(auVar31 * auVar79,0);
        uVar109 = uVar132 + uVar107;
        uVar107 = (ulong)CARRY8(uVar132,uVar107);
        uVar120 = uVar129 + uVar110;
        uVar111 = uVar120 + uVar107;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = local_24d8.d[3];
        auVar80._8_8_ = 0;
        auVar80._0_8_ = local_2498.d[2];
        uVar128 = SUB168(auVar32 * auVar80,8);
        uVar104 = SUB168(auVar32 * auVar80,0);
        local_2450 = uVar109 + uVar104;
        uVar104 = (ulong)CARRY8(uVar109,uVar104);
        uVar109 = uVar111 + uVar128;
        auVar98._8_8_ =
             (ulong)(CARRY8(uVar129,uVar110) || CARRY8(uVar120,uVar107)) +
             (ulong)(CARRY8(uVar111,uVar128) || CARRY8(uVar109,uVar104));
        auVar98._0_8_ = uVar109 + uVar104;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_24d8.d[3];
        auVar81._8_8_ = 0;
        auVar81._0_8_ = local_2498.d[3];
        local_2448 = auVar33 * auVar81 + auVar98;
        secp256k1_scalar_reduce_512(&local_24d8,&local_2478);
        psVar116 = local_2438 + (rings - 1);
        secp256k1_scalar_negate(psVar116,psVar116);
        secp256k1_scalar_add(blind,&local_24d8,psVar116);
        if ((mlen == (size_t *)0x0 || local_24e0 == (uchar *)0x0) || (*mlen == 0)) {
          if (mlen == (size_t *)0x0) {
            return 1;
          }
          *mlen = 0;
          return 1;
        }
        if (rings == 0) {
          uVar107 = 0;
        }
        else {
          uVar120 = 0;
          sVar119 = 0;
          uVar107 = 0;
          uVar104 = local_24e8;
          local_24b8 = psVar117;
          do {
            if (rsizes[sVar119] != 0) {
              uVar109 = (ulong)((uint)((ulong)local_24b8 >> ((char)sVar119 * '\x02' & 0x3fU)) & 3);
              local_24b0 = local_2438 + sVar119;
              puVar118 = local_2038 + uVar120 * 0x20;
              uVar128 = 0;
              uVar110 = uVar107;
              local_24a0 = uVar109;
              do {
                uVar129 = local_24e8;
                uVar107 = uVar110;
                if ((uVar120 != ~uVar106 + sVar1 + uVar105) && (uVar120 != uVar104)) {
                  if (uVar109 == uVar128) {
                    local_24a8 = uVar120 * 0x20;
                    psVar117 = ev + uVar120;
                    uVar107 = local_24b0->d[0];
                    uVar104 = local_24b0->d[1];
                    uVar109 = local_24b0->d[2];
                    uVar111 = psVar117->d[0];
                    uVar112 = psVar117->d[1];
                    uVar113 = psVar117->d[2];
                    uVar130 = psVar117->d[3];
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = uVar107;
                    auVar82._8_8_ = 0;
                    auVar82._0_8_ = uVar111;
                    uVar121 = SUB168(auVar34 * auVar82,8);
                    auVar102._8_8_ = 0;
                    auVar102._0_8_ = uVar121;
                    local_2478 = SUB168(auVar34 * auVar82,0);
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = uVar107;
                    auVar83._8_8_ = 0;
                    auVar83._0_8_ = uVar112;
                    auVar35 = auVar35 * auVar83;
                    uVar132 = SUB168(auVar35 + auVar102,0);
                    uVar122 = SUB168(auVar35 + auVar102,8);
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = uVar104;
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar111;
                    uVar133 = SUB168(auVar36 * auVar84,8);
                    uVar131 = SUB168(auVar36 * auVar84,0);
                    local_2470 = uVar132 + uVar131;
                    uVar131 = (ulong)CARRY8(uVar132,uVar131);
                    uVar132 = uVar122 + uVar133;
                    uVar123 = uVar132 + uVar131;
                    uVar134 = (ulong)CARRY8(auVar35._8_8_,(ulong)CARRY8(uVar121,auVar35._0_8_)) +
                              (ulong)(CARRY8(uVar122,uVar133) || CARRY8(uVar132,uVar131));
                    auVar37._8_8_ = 0;
                    auVar37._0_8_ = uVar107;
                    auVar85._8_8_ = 0;
                    auVar85._0_8_ = uVar113;
                    uVar124 = SUB168(auVar37 * auVar85,8);
                    uVar131 = SUB168(auVar37 * auVar85,0);
                    uVar121 = uVar123 + uVar131;
                    uVar131 = (ulong)CARRY8(uVar123,uVar131);
                    uVar133 = uVar134 + uVar124;
                    uVar135 = uVar133 + uVar131;
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = uVar104;
                    auVar86._8_8_ = 0;
                    auVar86._0_8_ = uVar112;
                    uVar114 = SUB168(auVar38 * auVar86,8);
                    uVar132 = SUB168(auVar38 * auVar86,0);
                    uVar123 = uVar121 + uVar132;
                    uVar132 = (ulong)CARRY8(uVar121,uVar132);
                    uVar122 = uVar135 + uVar114;
                    uVar136 = uVar122 + uVar132;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = uVar109;
                    auVar87._8_8_ = 0;
                    auVar87._0_8_ = uVar111;
                    uVar115 = SUB168(auVar39 * auVar87,8);
                    uVar121 = SUB168(auVar39 * auVar87,0);
                    local_2468 = uVar123 + uVar121;
                    uVar121 = (ulong)CARRY8(uVar123,uVar121);
                    uVar123 = uVar136 + uVar115;
                    uVar137 = uVar123 + uVar121;
                    uVar136 = (ulong)(CARRY8(uVar134,uVar124) || CARRY8(uVar133,uVar131)) +
                              (ulong)(CARRY8(uVar135,uVar114) || CARRY8(uVar122,uVar132)) +
                              (ulong)(CARRY8(uVar136,uVar115) || CARRY8(uVar123,uVar121));
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = uVar107;
                    auVar88._8_8_ = 0;
                    auVar88._0_8_ = uVar130;
                    uVar114 = SUB168(auVar40 * auVar88,8);
                    uVar107 = SUB168(auVar40 * auVar88,0);
                    uVar121 = uVar137 + uVar107;
                    uVar131 = (ulong)CARRY8(uVar137,uVar107);
                    uVar133 = uVar136 + uVar114;
                    uVar137 = uVar133 + uVar131;
                    uVar107 = local_24b0->d[3];
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = uVar104;
                    auVar89._8_8_ = 0;
                    auVar89._0_8_ = uVar113;
                    uVar115 = SUB168(auVar41 * auVar89,8);
                    uVar132 = SUB168(auVar41 * auVar89,0);
                    uVar123 = uVar121 + uVar132;
                    uVar132 = (ulong)CARRY8(uVar121,uVar132);
                    uVar122 = uVar137 + uVar115;
                    uVar125 = uVar122 + uVar132;
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = uVar109;
                    auVar90._8_8_ = 0;
                    auVar90._0_8_ = uVar112;
                    uVar134 = SUB168(auVar42 * auVar90,8);
                    uVar121 = SUB168(auVar42 * auVar90,0);
                    uVar124 = uVar123 + uVar121;
                    uVar121 = (ulong)CARRY8(uVar123,uVar121);
                    uVar123 = uVar125 + uVar134;
                    uVar126 = uVar123 + uVar121;
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = uVar107;
                    auVar91._8_8_ = 0;
                    auVar91._0_8_ = uVar111;
                    uVar135 = SUB168(auVar43 * auVar91,8);
                    uVar111 = SUB168(auVar43 * auVar91,0);
                    local_2460 = uVar124 + uVar111;
                    uVar111 = (ulong)CARRY8(uVar124,uVar111);
                    uVar124 = uVar126 + uVar135;
                    uVar127 = uVar124 + uVar111;
                    uVar124 = (ulong)(CARRY8(uVar136,uVar114) || CARRY8(uVar133,uVar131)) +
                              (ulong)(CARRY8(uVar137,uVar115) || CARRY8(uVar122,uVar132)) +
                              (ulong)(CARRY8(uVar125,uVar134) || CARRY8(uVar123,uVar121)) +
                              (ulong)(CARRY8(uVar126,uVar135) || CARRY8(uVar124,uVar111));
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = uVar104;
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = uVar130;
                    uVar133 = SUB168(auVar44 * auVar92,8);
                    uVar104 = SUB168(auVar44 * auVar92,0);
                    uVar132 = uVar127 + uVar104;
                    uVar104 = (ulong)CARRY8(uVar127,uVar104);
                    uVar131 = uVar124 + uVar133;
                    uVar114 = uVar131 + uVar104;
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = uVar109;
                    auVar93._8_8_ = 0;
                    auVar93._0_8_ = uVar113;
                    uVar122 = SUB168(auVar45 * auVar93,8);
                    uVar111 = SUB168(auVar45 * auVar93,0);
                    uVar121 = uVar132 + uVar111;
                    uVar111 = (ulong)CARRY8(uVar132,uVar111);
                    uVar132 = uVar114 + uVar122;
                    uVar115 = uVar132 + uVar111;
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = uVar107;
                    auVar94._8_8_ = 0;
                    auVar94._0_8_ = uVar112;
                    uVar123 = SUB168(auVar46 * auVar94,8);
                    uVar112 = SUB168(auVar46 * auVar94,0);
                    local_2458 = uVar121 + uVar112;
                    uVar112 = (ulong)CARRY8(uVar121,uVar112);
                    uVar121 = uVar115 + uVar123;
                    uVar134 = uVar121 + uVar112;
                    uVar132 = (ulong)(CARRY8(uVar124,uVar133) || CARRY8(uVar131,uVar104)) +
                              (ulong)(CARRY8(uVar114,uVar122) || CARRY8(uVar132,uVar111)) +
                              (ulong)(CARRY8(uVar115,uVar123) || CARRY8(uVar121,uVar112));
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = uVar109;
                    auVar95._8_8_ = 0;
                    auVar95._0_8_ = uVar130;
                    uVar131 = SUB168(auVar47 * auVar95,8);
                    uVar104 = SUB168(auVar47 * auVar95,0);
                    uVar112 = uVar134 + uVar104;
                    uVar104 = (ulong)CARRY8(uVar134,uVar104);
                    uVar111 = uVar132 + uVar131;
                    uVar121 = uVar111 + uVar104;
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = uVar107;
                    auVar96._8_8_ = 0;
                    auVar96._0_8_ = uVar113;
                    uVar113 = SUB168(auVar48 * auVar96,8);
                    uVar109 = SUB168(auVar48 * auVar96,0);
                    local_2450 = uVar112 + uVar109;
                    uVar109 = (ulong)CARRY8(uVar112,uVar109);
                    uVar112 = uVar121 + uVar113;
                    auVar99._8_8_ =
                         (ulong)(CARRY8(uVar132,uVar131) || CARRY8(uVar111,uVar104)) +
                         (ulong)(CARRY8(uVar121,uVar113) || CARRY8(uVar112,uVar109));
                    auVar99._0_8_ = uVar112 + uVar109;
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = uVar107;
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = uVar130;
                    local_2448 = auVar49 * auVar97 + auVar99;
                    secp256k1_scalar_reduce_512(&local_2498,&local_2478);
                    secp256k1_scalar_add(&local_24d8,s + uVar120,&local_2498);
                    uVar104 = uVar129;
                  }
                  else {
                    local_24d8.d[0] = s[uVar120].d[0];
                    local_24d8.d[1] = s[uVar120].d[1];
                    local_24d8.d[2] = s[uVar120].d[2];
                    local_24d8.d[3] = (s[uVar120].d + 2)[1];
                  }
                  secp256k1_scalar_get_b32(&local_2508,&local_24d8);
                  lVar108 = 0;
                  do {
                    (&local_2508)[lVar108] = (&local_2508)[lVar108] ^ puVar118[lVar108];
                    lVar108 = lVar108 + 1;
                  } while (lVar108 != 0x20);
                  lVar108 = 0;
                  do {
                    uVar107 = uVar110 + lVar108;
                    uVar109 = local_24a0;
                    if (*mlen <= uVar107) goto LAB_0014cb2c;
                    local_24e0[lVar108 + uVar110] = (&local_2508)[lVar108];
                    lVar108 = lVar108 + 1;
                  } while (lVar108 != 0x20);
                  uVar107 = uVar110 + 0x20;
                }
LAB_0014cb2c:
                uVar120 = uVar120 + 1;
                uVar128 = uVar128 + 1;
                puVar118 = puVar118 + 0x20;
                uVar110 = uVar107;
              } while (uVar128 < rsizes[sVar119]);
            }
            sVar119 = sVar119 + 1;
          } while (sVar119 != rings);
        }
        *mlen = uVar107;
        memset(local_2038,0,0x1000);
        memset(local_1038,0,0x1000);
        memset(local_2438,0,0x400);
        return 1;
      }
    }
    iVar103 = 0;
    if (mlen != (size_t *)0x0) {
      *mlen = 0;
      iVar103 = 0;
    }
  }
  return iVar103;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_rewind_inner(secp256k1_scalar *blind, uint64_t *v,
 unsigned char *m, size_t *mlen, secp256k1_scalar *ev, secp256k1_scalar *s,
 size_t *rsizes, size_t rings, const unsigned char *nonce, const secp256k1_ge *commit, const unsigned char *proof, size_t len, const secp256k1_ge *genp) {
    secp256k1_scalar s_orig[128];
    secp256k1_scalar sec[32];
    secp256k1_scalar stmp;
    unsigned char prep[4096];
    unsigned char tmp[32];
    uint64_t value;
    size_t offset;
    size_t i;
    size_t j;
    int b;
    size_t skip1;
    size_t skip2;
    size_t npub;
    npub = ((rings - 1) << 2) + rsizes[rings-1];
    VERIFY_CHECK(npub <= 128);
    VERIFY_CHECK(npub >= 1);
    memset(prep, 0, 4096);
    /* Reconstruct the provers random values. */
    secp256k1_rangeproof_genrand(sec, s_orig, prep, rsizes, rings, nonce, commit, proof, len, genp);
    *v = UINT64_MAX;
    secp256k1_scalar_clear(blind);
    if (rings == 1 && rsizes[0] == 1) {
        /* With only a single proof, we can only recover the blinding factor. */
        secp256k1_rangeproof_recover_x(blind, &s_orig[0], &ev[0], &s[0]);
        if (v) {
            *v = 0;
        }
        if (mlen) {
            *mlen = 0;
        }
        return 1;
    }
    npub = (rings - 1) << 2;
    for (j = 0; j < 2; j++) {
        size_t idx;
        /* Look for a value encoding in the last ring. */
        idx = npub + rsizes[rings - 1] - 1 - j;
        secp256k1_scalar_get_b32(tmp, &s[idx]);
        secp256k1_rangeproof_ch32xor(tmp, &prep[idx * 32]);
        if ((tmp[0] & 128) && (memcmp(&tmp[16], &tmp[24], 8) == 0) && (memcmp(&tmp[8], &tmp[16], 8) == 0)) {
            value = 0;
            for (i = 0; i < 8; i++) {
                value = (value << 8) + tmp[24 + i];
            }
            if (v) {
                *v = value;
            }
            memcpy(&prep[idx * 32], tmp, 32);
            break;
        }
    }
    if (j > 1) {
        /* Couldn't extract a value. */
        if (mlen) {
            *mlen = 0;
        }
        return 0;
    }
    skip1 = rsizes[rings - 1] - 1 - j;
    skip2 = ((value >> ((rings - 1) << 1)) & 3);
    if (skip1 == skip2) {
        /*Value is in wrong position.*/
        if (mlen) {
            *mlen = 0;
        }
        return 0;
    }
    skip1 += (rings - 1) << 2;
    skip2 += (rings - 1) << 2;
    /* Like in the rsize[] == 1 case, Having figured out which s is the one which was not forged, we can recover the blinding factor. */
    secp256k1_rangeproof_recover_x(&stmp, &s_orig[skip2], &ev[skip2], &s[skip2]);
    secp256k1_scalar_negate(&sec[rings - 1], &sec[rings - 1]);
    secp256k1_scalar_add(blind, &stmp, &sec[rings - 1]);
    if (!m || !mlen || *mlen == 0) {
        if (mlen) {
            *mlen = 0;
        }
        /* FIXME: cleanup in early out/failure cases. */
        return 1;
    }
    offset = 0;
    npub = 0;
    for (i = 0; i < rings; i++) {
        size_t idx;
        idx = (value >> (i << 1)) & 3;
        for (j = 0; j < rsizes[i]; j++) {
            if (npub == skip1 || npub == skip2) {
                npub++;
                continue;
            }
            if (idx == j) {
                /** For the non-forged signatures the signature is calculated instead of random, instead we recover the prover's nonces.
                 *  this could just as well recover the blinding factors and messages could be put there as is done for recovering the
                 *  blinding factor in the last ring, but it takes an inversion to recover x so it's faster to put the message data in k.
                 */
                secp256k1_rangeproof_recover_k(&stmp, &sec[i], &ev[npub], &s[npub]);
            } else {
                stmp = s[npub];
            }
            secp256k1_scalar_get_b32(tmp, &stmp);
            secp256k1_rangeproof_ch32xor(tmp, &prep[npub * 32]);
            for (b = 0; b < 32 && offset < *mlen; b++) {
                m[offset] = tmp[b];
                offset++;
            }
            npub++;
        }
    }
    *mlen = offset;
    memset(prep, 0, 4096);
    for (i = 0; i < 128; i++) {
        secp256k1_scalar_clear(&s_orig[i]);
    }
    for (i = 0; i < 32; i++) {
        secp256k1_scalar_clear(&sec[i]);
    }
    secp256k1_scalar_clear(&stmp);
    return 1;
}